

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFill.h
# Opt level: O0

void __thiscall NaPNFill::~NaPNFill(NaPNFill *this)

{
  NaPetriCnOutput *in_RDI;
  
  (in_RDI->super_NaPetriConnector)._vptr_NaPetriConnector = (_func_int **)&PTR__NaPNFill_00197fe8;
  NaVector::~NaVector((NaVector *)in_RDI);
  NaPetriCnOutput::~NaPetriCnOutput(in_RDI);
  NaPetriCnOutput::~NaPetriCnOutput(in_RDI);
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)0x176f8d);
  NaPetriNode::~NaPetriNode(&this->super_NaPetriNode);
  return;
}

Assistant:

class PNNA_API NaPNFill : public NaPetriNode
{
public:

  // Create node for Petri network
  NaPNFill (const char* szNodeName = "fill");


  ////////////////
  // Connectors //
  ////////////////

  // Input (mainstream)
  NaPetriCnInput	in;

  // Output (mainstream)
  NaPetriCnOutput	out;

  // Synchronize other nodes (-1 while filling and +1 another time)
  NaPetriCnOutput	sync;


  ///////////////////
  // Quick linkage //
  ///////////////////

  // Return mainstream output connector (the only output or NULL)
  virtual NaPetriConnector*	main_output_cn ();


  ///////////////////
  // Node specific //
  ///////////////////

  // Set number of data portions to fill (zeros by default)
  void		set_fill_number (unsigned n);
  void		set_fill_number (unsigned n, NaVector& vect);


  ///////////////////////
  // Phases of network //
  ///////////////////////

  // 2. Link connectors inside the node
  virtual void	relate_connectors ();

  // 5. Verification to be sure all is OK (true)
  virtual bool	verify ();

  // 7. Do one step of node activity and return true if succeeded
  virtual bool	activate ();

  // 8. True action of the node (if activate returned true)
  virtual void	action ();

  // 9. Finish data processing by the node (if activate returned true)
  virtual void	post_action ();

private:

  // Number of samples to skip
  unsigned	nFill;

  // Value to fill output with
  NaVector	vFill;

}